

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgga.c
# Opt level: O0

void xc_mgga_exc_vxc_fxc_kxc
               (xc_func_type *p,size_t np,double *rho,double *sigma,double *lapl,double *tau,
               double *zk,double *vrho,double *vsigma,double *vlapl,double *vtau,double *v2rho2,
               double *v2rhosigma,double *v2rholapl,double *v2rhotau,double *v2sigma2,
               double *v2sigmalapl,double *v2sigmatau,double *v2lapl2,double *v2lapltau,
               double *v2tau2,double *v3rho3,double *v3rho2sigma,double *v3rho2lapl,
               double *v3rho2tau,double *v3rhosigma2,double *v3rhosigmalapl,double *v3rhosigmatau,
               double *v3rholapl2,double *v3rholapltau,double *v3rhotau2,double *v3sigma3,
               double *v3sigma2lapl,double *v3sigma2tau,double *v3sigmalapl2,double *v3sigmalapltau,
               double *v3sigmatau2,double *v3lapl3,double *v3lapl2tau,double *v3lapltau2,
               double *v3tau3)

{
  xc_mgga_out_params out;
  undefined1 local_260 [608];
  
  memset(local_260,0,0x230);
  xc_mgga_new((xc_func_type *)out.v4sigma4,out.v4rhotau3._4_4_,(size_t)out.v4rholapltau2,
              out.v4rholapl2tau,out.v4rholapl3,out.v4rhosigmatau2,out.v4sigmalapltau2,
              (xc_mgga_out_params *)out.v4sigmatau3);
  return;
}

Assistant:

void xc_mgga_exc_vxc_fxc_kxc(const xc_func_type *p, size_t np,
                             const double *rho, const double *sigma, const double *lapl, const double *tau,
                             double *zk, double *vrho, double *vsigma, double *vlapl, double *vtau,
                             double *v2rho2, double *v2rhosigma, double *v2rholapl, double *v2rhotau,
                             double *v2sigma2, double *v2sigmalapl, double *v2sigmatau, double *v2lapl2,
                             double *v2lapltau, double *v2tau2,
                             double *v3rho3, double *v3rho2sigma, double *v3rho2lapl, double *v3rho2tau,
                             double *v3rhosigma2, double *v3rhosigmalapl, double *v3rhosigmatau,
                             double *v3rholapl2, double *v3rholapltau, double *v3rhotau2, double *v3sigma3,
                             double *v3sigma2lapl, double *v3sigma2tau, double *v3sigmalapl2, double *v3sigmalapltau,
                             double *v3sigmatau2, double *v3lapl3, double *v3lapl2tau, double *v3lapltau2,
                             double *v3tau3)
{
  xc_mgga_out_params out;
  libxc_memset(&out, 0, sizeof(xc_mgga_out_params));
  SET_ORDER_0;
  SET_ORDER_1;
  SET_ORDER_2;
  SET_ORDER_3;

  xc_mgga_new(p, 3, np, rho, sigma, lapl, tau, &out);
}